

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O1

char * gl4cts::anon_unknown_0::GetInput430c7
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data)

{
  pointer puVar1;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_data,0x90);
  puVar1 = (in_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1[0] = '\x01';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\x02';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\x03';
  puVar1[0xd] = '\0';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  puVar1[0x10] = '\0';
  puVar1[0x11] = '\0';
  puVar1[0x12] = 0x80;
  puVar1[0x13] = '@';
  puVar1[0x14] = '\0';
  puVar1[0x15] = '\0';
  puVar1[0x16] = '\0';
  puVar1[0x17] = '\0';
  puVar1[0x18] = '\0';
  puVar1[0x19] = '\0';
  puVar1[0x1a] = '\0';
  puVar1[0x1b] = '\0';
  puVar1[0x1c] = '\0';
  puVar1[0x1d] = '\0';
  puVar1[0x1e] = '\0';
  puVar1[0x1f] = '\0';
  puVar1[0x20] = '\0';
  puVar1[0x21] = '\0';
  puVar1[0x22] = 0xa0;
  puVar1[0x23] = '@';
  puVar1[0x24] = '\0';
  puVar1[0x25] = '\0';
  puVar1[0x26] = 0xc0;
  puVar1[0x27] = '@';
  puVar1[0x28] = '\0';
  puVar1[0x29] = '\0';
  puVar1[0x2a] = 0xe0;
  puVar1[0x2b] = '@';
  puVar1[0x2c] = '\0';
  puVar1[0x2d] = '\0';
  puVar1[0x2e] = '\0';
  puVar1[0x2f] = '\0';
  puVar1[0x30] = '\0';
  puVar1[0x31] = '\0';
  puVar1[0x32] = '\0';
  puVar1[0x33] = 'A';
  puVar1[0x34] = '\0';
  puVar1[0x35] = '\0';
  puVar1[0x36] = '\0';
  puVar1[0x37] = '\0';
  puVar1[0x38] = '\0';
  puVar1[0x39] = '\0';
  puVar1[0x3a] = '\0';
  puVar1[0x3b] = '\0';
  puVar1[0x3c] = '\0';
  puVar1[0x3d] = '\0';
  puVar1[0x3e] = '\0';
  puVar1[0x3f] = '\0';
  puVar1[0x40] = '\0';
  puVar1[0x41] = '\0';
  puVar1[0x42] = '\x10';
  puVar1[0x43] = 'A';
  puVar1[0x44] = '\0';
  puVar1[0x45] = '\0';
  puVar1[0x46] = ' ';
  puVar1[0x47] = 'A';
  puVar1[0x48] = '\0';
  puVar1[0x49] = '\0';
  puVar1[0x4a] = '0';
  puVar1[0x4b] = 'A';
  puVar1[0x4c] = '\0';
  puVar1[0x4d] = '\0';
  puVar1[0x4e] = '\0';
  puVar1[0x4f] = '\0';
  puVar1[0x50] = '\f';
  puVar1[0x51] = '\0';
  puVar1[0x52] = '\0';
  puVar1[0x53] = '\0';
  puVar1[0x54] = '\r';
  puVar1[0x55] = '\0';
  puVar1[0x56] = '\0';
  puVar1[0x57] = '\0';
  puVar1[0x58] = '\x0e';
  puVar1[0x59] = '\0';
  puVar1[0x5a] = '\0';
  puVar1[0x5b] = '\0';
  puVar1[0x5c] = '\x0f';
  puVar1[0x5d] = '\0';
  puVar1[0x5e] = '\0';
  puVar1[0x5f] = '\0';
  puVar1[0x60] = '\0';
  puVar1[0x61] = '\0';
  puVar1[0x62] = 0x80;
  puVar1[99] = 'A';
  puVar1[100] = '\0';
  puVar1[0x65] = '\0';
  puVar1[0x66] = '\0';
  puVar1[0x67] = '\0';
  puVar1[0x68] = '\0';
  puVar1[0x69] = '\0';
  puVar1[0x6a] = '\0';
  puVar1[0x6b] = '\0';
  puVar1[0x6c] = '\0';
  puVar1[0x6d] = '\0';
  puVar1[0x6e] = '\0';
  puVar1[0x6f] = '\0';
  puVar1[0x70] = '\0';
  puVar1[0x71] = '\0';
  puVar1[0x72] = 0x88;
  puVar1[0x73] = 'A';
  puVar1[0x74] = '\0';
  puVar1[0x75] = '\0';
  puVar1[0x76] = 0x90;
  puVar1[0x77] = 'A';
  puVar1[0x78] = '\0';
  puVar1[0x79] = '\0';
  puVar1[0x7a] = 0x98;
  puVar1[0x7b] = 'A';
  puVar1[0x7c] = '\0';
  puVar1[0x7d] = '\0';
  puVar1[0x7e] = '\0';
  puVar1[0x7f] = '\0';
  puVar1[0x80] = '\x14';
  puVar1[0x81] = '\0';
  puVar1[0x82] = '\0';
  puVar1[0x83] = '\0';
  puVar1[0x84] = '\x15';
  puVar1[0x85] = '\0';
  puVar1[0x86] = '\0';
  puVar1[0x87] = '\0';
  puVar1[0x88] = '\x16';
  puVar1[0x89] = '\0';
  puVar1[0x8a] = '\0';
  puVar1[0x8b] = '\0';
  puVar1[0x8c] = '\x17';
  puVar1[0x8d] = '\0';
  puVar1[0x8e] = '\0';
  puVar1[0x8f] = '\0';
  return (char *)puVar1;
}

Assistant:

const char* GetInput430c7(std::vector<GLubyte>& in_data)
{
	in_data.resize(36 * 4);
	int*   ip = reinterpret_cast<int*>(&in_data[0]);
	float* fp = reinterpret_cast<float*>(&in_data[0]);
	ip[0]	 = 1;
	ip[1]	 = 0;
	ip[2]	 = 2;
	ip[3]	 = 3;
	fp[4]	 = 4.0f;
	fp[5]	 = 0.0f;
	fp[6]	 = 0.0f;
	fp[7]	 = 0.0f;
	fp[8]	 = 5.0f;
	fp[9]	 = 6.0f;
	fp[10]	= 7.0f;
	fp[11]	= 0.0f;
	fp[12]	= 8.0f;
	fp[13]	= 0.0f;
	fp[14]	= 0.0f;
	fp[15]	= 0.0f;
	fp[16]	= 9.0f;
	fp[17]	= 10.0f;
	fp[18]	= 11.0f;
	fp[19]	= 0.0f;
	ip[20]	= 12;
	ip[21]	= 13;
	ip[22]	= 14;
	ip[23]	= 15;
	fp[24]	= 16.0f;
	fp[25]	= 0.0f;
	fp[26]	= 0.0f;
	fp[27]	= 0.0f;
	fp[28]	= 17.0f;
	fp[29]	= 18.0f;
	fp[30]	= 19.0f;
	fp[31]	= 0.0f;
	ip[32]	= 20;
	ip[33]	= 21;
	ip[34]	= 22;
	ip[35]	= 23;

	return NL "struct Struct0 {" NL "  ivec2 m0;" NL "};" NL "struct Struct1 {" NL "  vec3 m0;" NL "};" NL
			  "struct Struct3 {" NL "  int m0;" NL "};" NL "struct Struct2 {" NL "  float m0;" NL "  Struct1 m1;" NL
			  "  Struct0 m2;" NL "  int m3;" NL "  Struct3 m4;" NL "};" NL
			  "layout(std430, binding = 0) buffer Input {" NL "  int data0;" NL "  Struct0 data1;" NL
			  "  float data2;" NL "  Struct1 data3;" NL "  Struct2 data4[2];" NL "} g_input;" NL
			  "layout(std430, binding = 1) buffer Output {" NL "  int data0;" NL "  Struct0 data1;" NL
			  "  float data2;" NL "  Struct1 data3;" NL "  Struct2 data4[2];" NL "} g_output;" NL "void main() {" NL
			  "  g_output.data0 = g_input.data0;" NL "  g_output.data1 = g_input.data1;" NL
			  "  g_output.data2 = g_input.data2;" NL "  g_output.data3 = g_input.data3;" NL
			  "  for (int i = 0; i < g_input.data4.length(); ++i) g_output.data4[i] = g_input.data4[i];" NL "}";
}